

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O0

void __thiscall
gutil::Properties::getString(Properties *this,char *key,string *value,char *defvalue)

{
  bool bVar1;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_RCX;
  string *in_RDX;
  char *in_RSI;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff08;
  allocator *message;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 uVar3;
  allocator in_stack_ffffffffffffff57;
  string local_a8 [64];
  _Self local_68 [3];
  allocator local_49;
  string local_48 [32];
  _Self local_28;
  char *local_20;
  string *local_18;
  char *local_10;
  
  message = &local_49;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,in_RSI,message);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff08,(key_type *)0x11f9d3);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff08);
  bVar1 = std::operator!=(&local_28,local_68);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x11fa3b);
    std::__cxx11::string::operator=(local_18,(string *)&ppVar2->second);
  }
  else {
    if (local_20 == (char *)0x0) {
      uVar3 = 1;
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,local_10,(allocator *)&stack0xffffffffffffff57);
      std::operator+(local_10,__rhs);
      IOException::IOException
                ((IOException *)
                 CONCAT17(in_stack_ffffffffffffff57,CONCAT16(uVar3,in_stack_ffffffffffffff50)),
                 (string *)message);
      __cxa_throw(__rhs,&IOException::typeinfo,IOException::~IOException);
    }
    std::__cxx11::string::operator=(local_18,local_20);
  }
  return;
}

Assistant:

void Properties::getString(const char *key, std::string &value,
                           const char *defvalue) const
{
  std::map<std::string, std::string>::const_iterator it=data.find(key);

  if (it != data.end())
  {
    value=it->second;
  }
  else if (defvalue != 0)
  {
    value=defvalue;
  }
  else
  {
    throw IOException("Key not found: "+std::string(key));
  }
}